

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O0

void __thiscall
wasm::TypeBuilder::copyHeapType<TypeTest_CanonicalizeExactRefs_Test::TestBody()::__0>
          (TypeBuilder *this,size_t i,HeapType type,anon_class_8_1_911e227b map)

{
  Field element;
  pointer this_00;
  undefined8 uVar1;
  bool bVar2;
  undefined4 uVar3;
  HeapType *pHVar4;
  Type params;
  Type results;
  size_type __n;
  reference pFVar5;
  HeapType HVar6;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 auVar7 [16];
  Signature SVar8;
  Array AVar9;
  Continuation local_1f8;
  uintptr_t local_1f0;
  uintptr_t local_1e8;
  Array local_1e0;
  uintptr_t local_1d0;
  uintptr_t local_1c8;
  Type local_1c0;
  uintptr_t local_1b8;
  uintptr_t local_1b0;
  Field elem;
  undefined1 auStack_178 [8];
  Field field;
  __normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
  local_160;
  const_iterator __end4;
  const_iterator __begin4;
  FieldList *__range4;
  undefined1 local_138 [8];
  vector<wasm::Field,_std::allocator<wasm::Field>_> fields;
  Struct *struct_;
  Signature local_f8;
  uintptr_t local_e8;
  Signature sig;
  anon_class_16_2_ecc023e0 copyType;
  anon_class_16_2_633b9489 copySingleType;
  HeapType local_b0;
  _Storage<wasm::HeapType,_true> local_a8;
  undefined1 local_a0;
  _Storage<wasm::HeapType,_true> local_98;
  optional<wasm::HeapType> desc_1;
  HeapType local_80;
  _Storage<wasm::HeapType,_true> local_78;
  undefined1 local_70;
  _Storage<wasm::HeapType,_true> local_68;
  optional<wasm::HeapType> desc;
  HeapType local_50;
  _Storage<wasm::HeapType,_true> local_48;
  undefined1 local_40;
  _Storage<wasm::HeapType,_true> local_38;
  optional<wasm::HeapType> super;
  size_t i_local;
  TypeBuilder *this_local;
  anon_class_8_1_911e227b map_local;
  HeapType type_local;
  
  super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = i;
  this_local = map.builder;
  map_local.builder = (TypeBuilder *)type.id;
  bVar2 = HeapType::isBasic((HeapType *)&map_local);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    local_38 = (_Storage<wasm::HeapType,_true>)::wasm::HeapType::getDeclaredSuperType();
    super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = extraout_DL;
    bVar2 = std::optional::operator_cast_to_bool((optional *)&local_38._M_value);
    uVar1 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._8_8_;
    if (bVar2) {
      pHVar4 = std::optional<wasm::HeapType>::operator*
                         ((optional<wasm::HeapType> *)&local_38._M_value);
      desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = pHVar4->id;
      local_50 = TypeTest_CanonicalizeExactRefs_Test::TestBody::anon_class_8_1_911e227b::operator()
                           ((anon_class_8_1_911e227b *)&this_local,
                            (HeapType)
                            desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::HeapType>._8_8_);
      std::optional<wasm::HeapType>::optional<wasm::HeapType,_true>
                ((optional<wasm::HeapType> *)&local_48._M_value,&local_50);
      ::wasm::TypeBuilder::setSubType(this,uVar1,local_48,local_40);
    }
    local_68 = (_Storage<wasm::HeapType,_true>)::wasm::HeapType::getDescriptorType();
    desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = extraout_DL_00;
    bVar2 = std::optional::operator_cast_to_bool((optional *)&local_68._M_value);
    uVar1 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._8_8_;
    if (bVar2) {
      pHVar4 = std::optional<wasm::HeapType>::operator*
                         ((optional<wasm::HeapType> *)&local_68._M_value);
      desc_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = pHVar4->id;
      local_80 = TypeTest_CanonicalizeExactRefs_Test::TestBody::anon_class_8_1_911e227b::operator()
                           ((anon_class_8_1_911e227b *)&this_local,
                            (HeapType)
                            desc_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::HeapType>._8_8_);
      std::optional<wasm::HeapType>::optional<wasm::HeapType,_true>
                ((optional<wasm::HeapType> *)&local_78._M_value,&local_80);
      ::wasm::TypeBuilder::setDescriptor(this,uVar1,local_78,local_70);
    }
    local_98 = (_Storage<wasm::HeapType,_true>)::wasm::HeapType::getDescribedType();
    desc_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = extraout_DL_01;
    bVar2 = std::optional::operator_cast_to_bool((optional *)&local_98._M_value);
    uVar1 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._8_8_;
    if (bVar2) {
      pHVar4 = std::optional<wasm::HeapType>::operator*
                         ((optional<wasm::HeapType> *)&local_98._M_value);
      local_b0 = TypeTest_CanonicalizeExactRefs_Test::TestBody::anon_class_8_1_911e227b::operator()
                           ((anon_class_8_1_911e227b *)&this_local,pHVar4->id);
      std::optional<wasm::HeapType>::optional<wasm::HeapType,_true>
                ((optional<wasm::HeapType> *)&local_a8._M_value,&local_b0);
      ::wasm::TypeBuilder::setDescribed(this,uVar1,local_a8,local_a0);
    }
    uVar1 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._8_8_;
    ::wasm::HeapType::isOpen();
    ::wasm::TypeBuilder::setOpen((ulong)this,SUB81(uVar1,0));
    uVar1 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._8_8_;
    ::wasm::HeapType::getShared();
    ::wasm::TypeBuilder::setShared((ulong)this,(Shareability)uVar1);
    sig.results.id = (uintptr_t)&copyType.this;
    copyType.copySingleType = (anon_class_16_2_633b9489 *)this;
    copyType.this = this;
    uVar3 = ::wasm::HeapType::getKind();
    uVar1 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._8_8_;
    switch(uVar3) {
    case 0:
      ::wasm::handle_unreachable
                ("unexpected kind",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                 ,0x31b);
    case 1:
      auVar7 = ::wasm::HeapType::getSignature();
      uVar1 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._8_8_;
      sig.params.id = auVar7._8_8_;
      local_e8 = auVar7._0_8_;
      params = copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp:445:20)>
               ::anon_class_16_2_ecc023e0::operator()
                         ((anon_class_16_2_ecc023e0 *)&sig.results,local_e8);
      results = copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp:445:20)>
                ::anon_class_16_2_ecc023e0::operator()
                          ((anon_class_16_2_ecc023e0 *)&sig.results,sig.params);
      Signature::Signature(&local_f8,params,results);
      SVar8.results.id = local_f8.params.id;
      SVar8.params.id = uVar1;
      ::wasm::TypeBuilder::setHeapType((ulong)this,SVar8);
      break;
    case 2:
      fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)::wasm::HeapType::getStruct();
      std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_138);
      __n = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size
                      ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                       fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      std::vector<wasm::Field,_std::allocator<wasm::Field>_>::reserve
                ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_138,__n);
      this_00 = fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      __end4 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::begin
                         ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                          fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      local_160._M_current =
           (Field *)std::vector<wasm::Field,_std::allocator<wasm::Field>_>::end
                              ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)this_00);
      while (bVar2 = __gnu_cxx::operator!=(&__end4,&local_160),
            uVar1 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::HeapType>._8_8_, bVar2) {
        pFVar5 = __gnu_cxx::
                 __normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
                 ::operator*(&__end4);
        auStack_178 = (undefined1  [8])(pFVar5->type).id;
        field.type.id._0_4_ = pFVar5->packedType;
        field.type.id._4_4_ = pFVar5->mutable_;
        auStack_178 = (undefined1  [8])
                      copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp:445:20)>
                      ::anon_class_16_2_ecc023e0::operator()
                                ((anon_class_16_2_ecc023e0 *)&sig.results,(Type)auStack_178);
        std::vector<wasm::Field,_std::allocator<wasm::Field>_>::push_back
                  ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_138,
                   (value_type *)auStack_178);
        __gnu_cxx::
        __normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
        ::operator++(&__end4);
      }
      Struct::Struct((Struct *)&elem.packedType,(FieldList *)local_138);
      ::wasm::TypeBuilder::setHeapType((ulong)this,(Struct *)uVar1);
      Struct::~Struct((Struct *)&elem.packedType);
      std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector
                ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_138);
      break;
    case 3:
      ::wasm::HeapType::getArray();
      local_1b0 = local_1c0.id;
      elem.type.id = local_1b8;
      local_1d0 = local_1c0.id;
      local_1f0 = (uintptr_t)
                  copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp:445:20)>
                  ::anon_class_16_2_ecc023e0::operator()
                            ((anon_class_16_2_ecc023e0 *)&sig.results,local_1c0);
      uVar1 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._8_8_;
      local_1e8 = elem.type.id;
      element.packedType = (undefined4)elem.type.id;
      element.mutable_ = elem.type.id._4_4_;
      element.type.id = local_1f0;
      local_1c8 = local_1f0;
      local_1b0 = local_1f0;
      Array::Array(&local_1e0,element);
      AVar9.element._8_8_ = &local_1e0;
      AVar9.element.type.id = uVar1;
      ::wasm::TypeBuilder::setHeapType((ulong)this,AVar9);
      break;
    case 4:
      HVar6.id = ::wasm::HeapType::getContinuation();
      HVar6 = TypeTest_CanonicalizeExactRefs_Test::TestBody::anon_class_8_1_911e227b::operator()
                        ((anon_class_8_1_911e227b *)&this_local,HVar6);
      Continuation::Continuation(&local_1f8,HVar6);
      ::wasm::TypeBuilder::setHeapType((ulong)this,(Continuation)uVar1);
    }
    return;
  }
  __assert_fail("!type.isBasic()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x2df,
                "void wasm::TypeBuilder::copyHeapType(size_t, HeapType, F) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp:445:20)]"
               );
}

Assistant:

void copyHeapType(size_t i, HeapType type, F map) {
    assert(!type.isBasic());
    if (auto super = type.getDeclaredSuperType()) {
      setSubType(i, map(*super));
    }
    if (auto desc = type.getDescriptorType()) {
      setDescriptor(i, map(*desc));
    }
    if (auto desc = type.getDescribedType()) {
      setDescribed(i, map(*desc));
    }
    setOpen(i, type.isOpen());
    setShared(i, type.getShared());

    auto copySingleType = [&](Type t) -> Type {
      if (t.isBasic()) {
        return t;
      }
      assert(t.isRef());
      return getTempRefType(
        map(t.getHeapType()), t.getNullability(), t.getExactness());
    };
    auto copyType = [&](Type t) -> Type {
      if (t.isTuple()) {
        std::vector<Type> elems;
        elems.reserve(t.size());
        for (auto elem : t) {
          elems.push_back(copySingleType(elem));
        }
        return getTempTupleType(elems);
      }
      return copySingleType(t);
    };
    switch (type.getKind()) {
      case HeapTypeKind::Func: {
        auto sig = type.getSignature();
        setHeapType(i, Signature(copyType(sig.params), copyType(sig.results)));
        return;
      }
      case HeapTypeKind::Struct: {
        const auto& struct_ = type.getStruct();
        std::vector<Field> fields;
        fields.reserve(struct_.fields.size());
        for (auto field : struct_.fields) {
          field.type = copyType(field.type);
          fields.push_back(field);
        }
        setHeapType(i, Struct(fields));
        return;
      }
      case HeapTypeKind::Array: {
        auto elem = type.getArray().element;
        elem.type = copyType(elem.type);
        // MSVC gets confused without this disambiguation.
        setHeapType(i, wasm::Array(elem));
        return;
      }
      case HeapTypeKind::Cont:
        setHeapType(i, Continuation(map(type.getContinuation().type)));
        return;
      case HeapTypeKind::Basic:
        WASM_UNREACHABLE("unexpected kind");
    }
  }